

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Group::~Group(Group *this)

{
  Group *this_local;
  
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Group_00366180;
  std::function<bool_(const_args::Group_&)>::~function(&this->validator);
  std::vector<args::Base_*,_std::allocator<args::Base_*>_>::~vector(&this->children);
  Base::~Base(&this->super_Base);
  return;
}

Assistant:

virtual ~Group() {}